

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::ShadeVertsLinearUV
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 *a,ImVec2 *b,
               ImVec2 *uv_a,ImVec2 *uv_b,bool clamp)

{
  ImDrawVert *pIVar1;
  ImDrawVert *pIVar2;
  ImVec2 IVar3;
  float local_dc;
  float local_d4;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImDrawVert *local_b0;
  ImDrawVert *vertex_1;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImDrawVert *local_78;
  ImDrawVert *vertex;
  ImVec2 max;
  ImVec2 min;
  ImDrawVert *vert_end;
  ImDrawVert *vert_start;
  ImVec2 scale;
  ImVec2 uv_size;
  ImVec2 size;
  bool clamp_local;
  ImVec2 *uv_a_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  int vert_end_idx_local;
  int vert_start_idx_local;
  ImDrawList *draw_list_local;
  
  IVar3 = operator-(b,a);
  scale = operator-(uv_b,uv_a);
  uv_size.x = IVar3.x;
  if ((uv_size.x != 0.0) || (NAN(uv_size.x))) {
    local_d4 = scale.x / uv_size.x;
  }
  else {
    local_d4 = 0.0;
  }
  uv_size.y = IVar3.y;
  if ((uv_size.y != 0.0) || (NAN(uv_size.y))) {
    local_dc = scale.y / uv_size.y;
  }
  else {
    local_dc = 0.0;
  }
  ImVec2::ImVec2((ImVec2 *)((long)&vert_start + 4),local_d4,local_dc);
  pIVar1 = (draw_list->VtxBuffer).Data + vert_start_idx;
  pIVar2 = (draw_list->VtxBuffer).Data + vert_end_idx;
  local_b0 = pIVar1;
  if (clamp) {
    max = ImMin(uv_a,uv_b);
    vertex = (ImDrawVert *)ImMax(uv_a,uv_b);
    for (local_78 = pIVar1; local_78 < pIVar2; local_78 = local_78 + 1) {
      ImVec2::ImVec2(&local_a0,(local_78->pos).x,(local_78->pos).y);
      local_98 = operator-(&local_a0,a);
      local_90 = ImMul(&local_98,(ImVec2 *)((long)&vert_start + 4));
      local_88 = ::operator+(uv_a,&local_90);
      vertex_1 = vertex;
      local_80 = ImClamp(&local_88,&max,(ImVec2)vertex);
      local_78->uv = local_80;
    }
  }
  else {
    for (; local_b0 < pIVar2; local_b0 = local_b0 + 1) {
      ImVec2::ImVec2(&local_d0,(local_b0->pos).x,(local_b0->pos).y);
      local_c8 = operator-(&local_d0,a);
      local_c0 = ImMul(&local_c8,(ImVec2 *)((long)&vert_start + 4));
      local_b8 = ::operator+(uv_a,&local_c0);
      local_b0->uv = local_b8;
    }
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearUV(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, bool clamp)
{
    const ImVec2 size = b - a;
    const ImVec2 uv_size = uv_b - uv_a;
    const ImVec2 scale = ImVec2(
        size.x != 0.0f ? (uv_size.x / size.x) : 0.0f,
        size.y != 0.0f ? (uv_size.y / size.y) : 0.0f);

    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    if (clamp)
    {
        const ImVec2 min = ImMin(uv_a, uv_b);
        const ImVec2 max = ImMax(uv_a, uv_b);
        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = ImClamp(uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale), min, max);
    }
    else
    {
        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale);
    }
}